

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

void deserialize_unsorted_keys(void)

{
  char data [17];
  uint7 in_stack_fffffffffffffff9;
  
  invalid_deserialize_test((void *)data._0_8_,(ulong)in_stack_fffffffffffffff9 << 8,(char *)0x0);
  return;
}

Assistant:

DEFINE_TEST(deserialize_unsorted_keys) {
    // clang-format off
    const char data[] = {
        0x3B, 0x30, // Serial Cookie
        1, 0,       // Container count - 1
        0,          // Run Flag Bitset (no runs)
        1, 0,       // Upper 16 bits of the first container
        0, 0,       // Cardinality - 1 of the first container
        0, 0,       // Upper 16 bits of the second container (LESS THAN FIRST)
        0, 0,       // Cardinality - 1 of the second container
        0, 0,       // Only value of first container
        0, 0,       // Only value of second container
    };
    // clang-format on
    invalid_deserialize_test(data, sizeof(data), "unsorted keys");
}